

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O1

ZyanStatus
ZydisFormatterSetProperty
          (ZydisFormatter *formatter,ZydisFormatterProperty property,ZyanUPointer value)

{
  bool bVar1;
  size_t __n;
  ZyanStatus ZVar2;
  char *__dest;
  long lVar3;
  long lVar4;
  ZydisNumericBase ZVar5;
  
  ZVar2 = 0x80100004;
  if (formatter == (ZydisFormatter *)0x0) {
    return 0x80100004;
  }
  ZVar5 = (ZydisNumericBase)value;
  switch(property) {
  case ZYDIS_FORMATTER_PROP_FORCE_SIZE:
    formatter->force_memory_size = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_FORCE_SEGMENT:
    formatter->force_memory_segment = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_FORCE_SCALE_ONE:
    formatter->force_memory_scale = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_FORCE_RELATIVE_BRANCHES:
    formatter->force_relative_branches = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_FORCE_RELATIVE_RIPREL:
    formatter->force_relative_riprel = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_PRINT_BRANCH_SIZE:
    formatter->print_branch_size = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_DETAILED_PREFIXES:
    formatter->detailed_prefixes = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_ADDR_BASE:
    if (1 < value) {
      return 0x80100004;
    }
    formatter->addr_base = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_ADDR_SIGNEDNESS:
    if (2 < value) {
      return 0x80100004;
    }
    formatter->addr_signedness = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_ADDR_PADDING_ABSOLUTE:
    if (0xff < value && ZVar5 != ~ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    formatter->addr_padding_absolute = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_ADDR_PADDING_RELATIVE:
    if (0xff < value && ZVar5 != ~ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    formatter->addr_padding_relative = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_DISP_BASE:
    if (1 < value) {
      return 0x80100004;
    }
    formatter->disp_base = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_DISP_SIGNEDNESS:
    if (2 < value) {
      return 0x80100004;
    }
    formatter->disp_signedness = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_DISP_PADDING:
    if (ZVar5 == ~ZYDIS_NUMERIC_BASE_DEC) {
      if (2 < (ulong)formatter->style) {
        return 0x80100004;
      }
      formatter->disp_padding = FORMATTER_PRESETS[formatter->style]->disp_padding;
    }
    else if (0xff < value) {
      return 0x80100004;
    }
    formatter->disp_padding = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_IMM_BASE:
    if (1 < value) {
      return 0x80100004;
    }
    formatter->imm_base = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_IMM_SIGNEDNESS:
    if (2 < value) {
      return 0x80100004;
    }
    formatter->imm_signedness = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_IMM_PADDING:
    if (ZVar5 == ~ZYDIS_NUMERIC_BASE_DEC) {
      if (2 < (ulong)formatter->style) {
        return 0x80100004;
      }
      formatter->imm_padding = FORMATTER_PRESETS[formatter->style]->imm_padding;
    }
    else if (0xff < value) {
      return 0x80100004;
    }
    formatter->imm_padding = ZVar5;
    break;
  case ZYDIS_FORMATTER_PROP_UPPERCASE_PREFIXES:
    formatter->case_prefixes = (uint)(value != 0) * 2;
    break;
  case ZYDIS_FORMATTER_PROP_UPPERCASE_MNEMONIC:
    formatter->case_mnemonic = (uint)(value != 0) * 2;
    break;
  case ZYDIS_FORMATTER_PROP_UPPERCASE_REGISTERS:
    formatter->case_registers = (uint)(value != 0) * 2;
    break;
  case ZYDIS_FORMATTER_PROP_UPPERCASE_TYPECASTS:
    formatter->case_typecasts = (uint)(value != 0) * 2;
    break;
  case ZYDIS_FORMATTER_PROP_UPPERCASE_DECORATORS:
    formatter->case_decorators = (uint)(value != 0) * 2;
    break;
  case ZYDIS_FORMATTER_PROP_DEC_PREFIX:
    lVar4 = 0;
    goto LAB_0011a866;
  case ZYDIS_FORMATTER_PROP_DEC_SUFFIX:
    lVar3 = 1;
    bVar1 = false;
    lVar4 = 0;
    goto LAB_0011a749;
  case ZYDIS_FORMATTER_PROP_HEX_UPPERCASE:
    formatter->hex_uppercase = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_HEX_FORCE_LEADING_NUMBER:
    formatter->hex_force_leading_number = value != 0;
    break;
  case ZYDIS_FORMATTER_PROP_HEX_PREFIX:
    lVar4 = 1;
LAB_0011a866:
    bVar1 = false;
    lVar3 = 0;
    goto LAB_0011a749;
  case ZYDIS_FORMATTER_PROP_HEX_SUFFIX:
    lVar4 = 1;
    bVar1 = false;
    lVar3 = 1;
    goto LAB_0011a749;
  default:
    goto switchD_0011a59f_default;
  }
  lVar4 = 0xffffffff;
  lVar3 = 0xff;
  bVar1 = true;
LAB_0011a749:
  if (!bVar1) {
    if (value == 0) {
      formatter->number_format[lVar4][lVar3].string = (ZyanStringView *)0x0;
    }
    else {
      __n = strlen((char *)value);
      if (10 < __n) {
        return 0x80100004;
      }
      __dest = formatter->number_format[lVar4][lVar3].buffer;
      memcpy(__dest,(void *)value,__n);
      formatter->number_format[lVar4][lVar3].buffer[__n] = '\0';
      formatter->number_format[lVar4][lVar3].string_data.string.vector.data = __dest;
      formatter->number_format[lVar4][lVar3].string_data.string.vector.size = __n + 1;
      formatter->number_format[lVar4][lVar3].string =
           &formatter->number_format[lVar4][lVar3].string_data;
    }
  }
  ZVar2 = 0x100000;
switchD_0011a59f_default:
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterSetProperty(ZydisFormatter* formatter, ZydisFormatterProperty property,
    ZyanUPointer value)
{
    if (!formatter)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisNumericBase base = (ZydisNumericBase)(-1);
    ZyanU8 index = 0xFF;

    switch (property)
    {
    case ZYDIS_FORMATTER_PROP_FORCE_SIZE:
    {
        formatter->force_memory_size = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_FORCE_SEGMENT:
    {
        formatter->force_memory_segment = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_FORCE_SCALE_ONE:
    {
        formatter->force_memory_scale = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_FORCE_RELATIVE_BRANCHES:
    {
        formatter->force_relative_branches = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_FORCE_RELATIVE_RIPREL:
    {
        formatter->force_relative_riprel = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_PRINT_BRANCH_SIZE:
    {
        formatter->print_branch_size = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DETAILED_PREFIXES:
    {
        formatter->detailed_prefixes = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_ADDR_BASE:
    {
        if (value > ZYDIS_NUMERIC_BASE_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->addr_base = (ZydisNumericBase)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_ADDR_SIGNEDNESS:
    {
        if (value > ZYDIS_SIGNEDNESS_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->addr_signedness = (ZydisSignedness)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_ADDR_PADDING_ABSOLUTE:
    {
        if (((ZydisPadding)value != ZYDIS_PADDING_AUTO) &&
            (value > 0xFF))
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->addr_padding_absolute = (ZydisPadding)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_ADDR_PADDING_RELATIVE:
    {
        if (((ZydisPadding)value != ZYDIS_PADDING_AUTO) &&
            (value > 0xFF))
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->addr_padding_relative = (ZydisPadding)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DISP_BASE:
    {
        if (value > ZYDIS_NUMERIC_BASE_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->disp_base = (ZydisNumericBase)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DISP_SIGNEDNESS:
    {
        if (value > ZYDIS_SIGNEDNESS_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->disp_signedness = (ZydisSignedness)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DISP_PADDING:
    {
        if ((ZydisPadding)value == ZYDIS_PADDING_AUTO)
        {
            if ((ZyanUSize)formatter->style > ZYDIS_FORMATTER_STYLE_MAX_VALUE)
            {
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
            formatter->disp_padding = FORMATTER_PRESETS[formatter->style]->disp_padding;
        }
        else if (value > 0xFF)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->disp_padding = (ZydisPadding)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_IMM_BASE:
    {
        if (value > ZYDIS_NUMERIC_BASE_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->imm_base = (ZydisNumericBase)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_IMM_SIGNEDNESS:
    {
        if (value > ZYDIS_SIGNEDNESS_MAX_VALUE)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->imm_signedness  = (ZydisSignedness)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_IMM_PADDING:
    {
        if ((ZydisPadding)value == ZYDIS_PADDING_AUTO)
        {
            if ((ZyanUSize)formatter->style > ZYDIS_FORMATTER_STYLE_MAX_VALUE)
            {
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
            formatter->imm_padding = FORMATTER_PRESETS[formatter->style]->imm_padding;
        }
        else if (value > 0xFF)
        {
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        formatter->imm_padding = (ZydisPadding)value;
        break;
    }
    case ZYDIS_FORMATTER_PROP_UPPERCASE_PREFIXES:
    {
        formatter->case_prefixes = (value) ? ZYDIS_LETTER_CASE_UPPER : ZYDIS_LETTER_CASE_DEFAULT;
        break;
    }
    case ZYDIS_FORMATTER_PROP_UPPERCASE_MNEMONIC:
    {
        formatter->case_mnemonic = (value) ? ZYDIS_LETTER_CASE_UPPER : ZYDIS_LETTER_CASE_DEFAULT;
        break;
    }
    case ZYDIS_FORMATTER_PROP_UPPERCASE_REGISTERS:
    {
        formatter->case_registers = (value) ? ZYDIS_LETTER_CASE_UPPER : ZYDIS_LETTER_CASE_DEFAULT;
        break;
    }
    case ZYDIS_FORMATTER_PROP_UPPERCASE_TYPECASTS:
    {
        formatter->case_typecasts = (value) ? ZYDIS_LETTER_CASE_UPPER : ZYDIS_LETTER_CASE_DEFAULT;
        break;
    }
    case ZYDIS_FORMATTER_PROP_UPPERCASE_DECORATORS:
    {
        formatter->case_decorators = (value) ? ZYDIS_LETTER_CASE_UPPER : ZYDIS_LETTER_CASE_DEFAULT;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DEC_PREFIX:
    {
        base  = ZYDIS_NUMERIC_BASE_DEC;
        index = 0;
        break;
    }
    case ZYDIS_FORMATTER_PROP_DEC_SUFFIX:
    {
        base  = ZYDIS_NUMERIC_BASE_DEC;
        index = 1;
        break;
    }
    case ZYDIS_FORMATTER_PROP_HEX_UPPERCASE:
    {
        formatter->hex_uppercase = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_HEX_FORCE_LEADING_NUMBER:
    {
        formatter->hex_force_leading_number = (value) ? ZYAN_TRUE : ZYAN_FALSE;
        break;
    }
    case ZYDIS_FORMATTER_PROP_HEX_PREFIX:
    {
        base  = ZYDIS_NUMERIC_BASE_HEX;
        index = 0;
        break;
    }
    case ZYDIS_FORMATTER_PROP_HEX_SUFFIX:
    {
        base  = ZYDIS_NUMERIC_BASE_HEX;
        index = 1;
        break;
    }
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    // Set prefix or suffix
    if (base != (ZydisNumericBase)(-1))
    {
        if (value)
        {
            const ZyanUSize len = ZYAN_STRLEN((char*)value);
            if (len > 10)
            {
                return ZYAN_STATUS_INVALID_ARGUMENT;
            }
            ZYAN_MEMCPY(formatter->number_format[base][index].buffer, (void*)value, len);
            formatter->number_format[base][index].buffer[len] = '\0';
            formatter->number_format[base][index].string_data.string.vector.data =
                formatter->number_format[base][index].buffer;
            formatter->number_format[base][index].string_data.string.vector.size = len + 1;
            formatter->number_format[base][index].string =
                &formatter->number_format[base][index].string_data;
        } else
        {
            formatter->number_format[base][index].string = ZYAN_NULL;
        }
    }

    return ZYAN_STATUS_SUCCESS;
}